

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.h
# Opt level: O0

int __thiscall
kj::FunctionParam<int_(char,_bool)>::
Wrapper<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/function-test.c++:138:36)>
::operator()(Wrapper<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_function_test_c__:138:36)>
             *this,char params,bool params_1)

{
  char c;
  anon_class_4_1_54a39809 *this_00;
  int iVar1;
  char *pcVar2;
  bool *pbVar3;
  NoInfer<bool> local_12;
  char local_11;
  bool params_local_1;
  Wrapper<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_function_test_c__:138:36)>
  *pWStack_10;
  char params_local;
  Wrapper<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_function_test_c__:138:36)>
  *this_local;
  
  this_00 = this->func;
  local_12 = params_1;
  local_11 = params;
  pWStack_10 = this;
  pcVar2 = fwd<char>(&local_11);
  c = *pcVar2;
  pbVar3 = fwd<bool>(&local_12);
  iVar1 = anon_unknown_0::TestCase135::run::anon_class_4_1_54a39809::operator()
                    (this_00,c,(bool)(*pbVar3 & 1));
  return iVar1;
}

Assistant:

inline Return operator()(Params... params) override {
      return func(kj::fwd<Params>(params)...);
    }